

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

nodetest_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_node_test_type
          (xpath_parser *this,xpath_lexer_string *name)

{
  bool bVar1;
  xpath_lexer_string *name_local;
  xpath_parser *this_local;
  
  switch(*name->begin) {
  case 'c':
    bVar1 = xpath_lexer_string::operator==(name,"comment");
    if (bVar1) {
      return nodetest_type_comment;
    }
    break;
  default:
    break;
  case 'n':
    bVar1 = xpath_lexer_string::operator==(name,"node");
    if (bVar1) {
      return nodetest_type_node;
    }
    break;
  case 'p':
    bVar1 = xpath_lexer_string::operator==(name,"processing-instruction");
    if (bVar1) {
      return nodetest_type_pi;
    }
    break;
  case 't':
    bVar1 = xpath_lexer_string::operator==(name,"text");
    if (bVar1) {
      return nodetest_type_text;
    }
  }
  return nodetest_none;
}

Assistant:

nodetest_t parse_node_test_type(const xpath_lexer_string& name)
		{
			switch (name.begin[0])
			{
			case 'c':
				if (name == PUGIXML_TEXT("comment"))
					return nodetest_type_comment;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("node"))
					return nodetest_type_node;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("processing-instruction"))
					return nodetest_type_pi;

				break;

			case 't':
				if (name == PUGIXML_TEXT("text"))
					return nodetest_type_text;

				break;
			
			default:
				break;
			}

			return nodetest_none;
		}